

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void Catch::writeCounts(JsonObjectWriter *writer,Counts *counts)

{
  int __fd;
  undefined1 local_1b0 [408];
  
  __fd = (int)writer;
  JsonObjectWriter::write((JsonObjectWriter *)local_1b0,__fd,"passed",6);
  JsonValueWriter::writeImpl<unsigned_long,void>((JsonValueWriter *)local_1b0,&counts->passed,false)
  ;
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x88));
  JsonObjectWriter::write((JsonObjectWriter *)local_1b0,__fd,"failed",6);
  JsonValueWriter::writeImpl<unsigned_long,void>((JsonValueWriter *)local_1b0,&counts->failed,false)
  ;
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x88));
  JsonObjectWriter::write((JsonObjectWriter *)local_1b0,__fd,"fail-but-ok",0xb);
  JsonValueWriter::writeImpl<unsigned_long,void>
            ((JsonValueWriter *)local_1b0,&counts->failedButOk,false);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x88));
  JsonObjectWriter::write((JsonObjectWriter *)local_1b0,__fd,"skipped",7);
  JsonValueWriter::writeImpl<unsigned_long,void>
            ((JsonValueWriter *)local_1b0,&counts->skipped,false);
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x88));
  return;
}

Assistant:

static void writeCounts( JsonObjectWriter&& writer, Counts const& counts ) {
        writer.write( "passed"_sr ).write( counts.passed );
        writer.write( "failed"_sr ).write( counts.failed );
        writer.write( "fail-but-ok"_sr ).write( counts.failedButOk );
        writer.write( "skipped"_sr ).write( counts.skipped );
    }